

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall cppnet::List<cppnet::BufferBlock>::Clear(List<cppnet::BufferBlock> *this)

{
  this->_size = 0;
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_head).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_tail).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void Clear() {
        _size = 0;

        _head.reset();
        _tail.reset();
    }